

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFun.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string string2;
  string string1;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  string local_48;
  string local_28;
  
  local_68 = local_58;
  local_60 = 0;
  local_58[0] = 0;
  local_88 = local_78;
  local_80 = 0;
  local_78[0] = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,"Enter two strings.");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"String 1: ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_68);
  std::operator<<((ostream *)&std::cout,"String 2: ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_88);
  std::__cxx11::string::string((string *)&local_28,(string *)&local_68);
  std::__cxx11::string::string((string *)&local_48,(string *)&local_88);
  bVar1 = StrComp(&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  pcVar3 = "The strings are different.";
  if (bVar1) {
    pcVar3 = "The strings are the same.";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  return 0;
}

Assistant:

int main()
{
    string string1;
    string string2;

    cout << "Enter two strings." << endl;
    cout << "String 1: ";
    getline(cin, string1);
    cout << "String 2: ";
    getline(cin, string2);

    bool same = StrComp(string1, string2);

    if(same)
    {
        cout << "The strings are the same." << endl;
    }
    else
    {
        cout << "The strings are different." << endl;
    }

    return 0;
}